

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

void __thiscall tl::StrT<char32_t>::construct(StrT<char32_t> *this,CStrT<char32_t> o)

{
  u32 uVar1;
  char32_t cVar2;
  char32_t *pcVar3;
  u32 i;
  ulong uVar4;
  CStrT<char32_t> local_28;
  
  local_28._str = o._str;
  local_28._size = o._size;
  this->_size = local_28._size;
  uVar1 = calcCapacity(local_28._size);
  pcVar3 = (char32_t *)operator_new__((ulong)uVar1 << 2);
  this->_str = pcVar3;
  for (uVar4 = 0; uVar4 < this->_size; uVar4 = uVar4 + 1) {
    cVar2 = CStrT<char32_t>::operator[](&local_28,(u32)uVar4);
    pcVar3 = this->_str;
    pcVar3[uVar4] = cVar2;
  }
  pcVar3[this->_size] = L'\0';
  return;
}

Assistant:

void StrT<CharT>::construct(CStrT<CharT> o)
{
    _size = o.size();
    const u32 capacity = calcCapacity(_size);
    _str = new CharT[capacity];
    for(u32 i=0; i<_size; i++) {
        _str[i] = o[i];
    }
    _str[_size] = 0;
}